

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void sarima_predict(sarima_object obj,double *inp,int L,double *xpred,double *amse)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int s;
  int d;
  int N;
  int D;
  double *pdVar5;
  double *pdVar6;
  uint ip;
  int id;
  double *C;
  double *C_00;
  double *oup;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  double dVar15;
  double dVar16;
  
  uVar1 = obj->p;
  uVar2 = obj->q;
  uVar3 = obj->P;
  uVar4 = obj->Q;
  s = obj->s;
  lVar13 = (long)s;
  ip = s * uVar3 + uVar1;
  uVar14 = uVar4 * s + uVar2 + 1;
  if ((int)uVar14 < (int)ip) {
    uVar14 = ip;
  }
  d = obj->d;
  N = obj->N;
  D = obj->D;
  C = (double *)malloc((long)d * 8 + 8);
  iVar12 = s * D;
  C_00 = (double *)malloc((long)iVar12 * 8 + 8);
  id = d + iVar12;
  oup = (double *)malloc((long)id * 8 + 8);
  __size = (long)N * 8;
  W = (double *)malloc(__size);
  resid = (double *)malloc(__size);
  phi = (double *)malloc((long)(int)uVar14 << 3);
  theta = (double *)malloc((long)(int)uVar14 << 3);
  *C_00 = 1.0;
  *C = 1.0;
  dVar15 = 0.0;
  if (D == 0 && d == 0) {
    *oup = 1.0;
    dVar15 = obj->mean;
  }
  if (0 < d) {
    deld(d,C);
  }
  if (0 < D) {
    delds(D,s,C_00);
  }
  conv(C,d + 1,C_00,iVar12 + 1,oup);
  if (0 < id) {
    uVar7 = 1;
    do {
      oup[uVar7] = -oup[uVar7];
      uVar7 = uVar7 + 1;
    } while (d + iVar12 + 1 != uVar7);
  }
  if (0 < N) {
    pdVar5 = obj->res;
    lVar8 = 0;
    do {
      dVar16 = inp[lVar8];
      if (D == 0 && d == 0) {
        dVar16 = dVar16 - dVar15;
      }
      W[lVar8] = dVar16;
      resid[lVar8] = pdVar5[lVar8];
      lVar8 = lVar8 + 1;
    } while (N != lVar8);
  }
  if (0 < (int)uVar14) {
    memset(theta,0,(ulong)uVar14 << 3);
    memset(phi,0,(ulong)uVar14 << 3);
  }
  if (0 < (int)uVar1) {
    pdVar5 = obj->phi;
    uVar7 = 0;
    do {
      phi[uVar7] = pdVar5[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  if (0 < (int)uVar2) {
    pdVar5 = obj->theta;
    uVar7 = 0;
    do {
      theta[uVar7] = -pdVar5[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  if (0 < (int)uVar3) {
    pdVar5 = obj->PHI;
    uVar7 = 0;
    pdVar9 = phi;
    do {
      pdVar9 = pdVar9 + lVar13;
      uVar10 = uVar7 + 1;
      phi[uVar10 * lVar13 + -1] = pdVar5[uVar7] + phi[uVar10 * lVar13 + -1];
      if (0 < (int)uVar1) {
        pdVar6 = obj->phi;
        uVar11 = 0;
        do {
          pdVar9[uVar11] = pdVar9[uVar11] - pdVar6[uVar11] * pdVar5[uVar7];
          uVar11 = uVar11 + 1;
        } while (uVar1 != uVar11);
      }
      uVar7 = uVar10;
    } while (uVar10 != uVar3);
  }
  if (0 < (int)uVar4) {
    pdVar5 = obj->THETA;
    uVar7 = 0;
    pdVar9 = theta;
    do {
      pdVar9 = pdVar9 + lVar13;
      uVar10 = uVar7 + 1;
      theta[uVar10 * lVar13 + -1] = theta[uVar10 * lVar13 + -1] - pdVar5[uVar7];
      if (0 < (int)uVar2) {
        pdVar6 = obj->theta;
        uVar11 = 0;
        do {
          pdVar9[uVar11] = pdVar6[uVar11] * pdVar5[uVar7] + pdVar9[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar7 = uVar10;
    } while (uVar10 != uVar4);
  }
  forkal(ip,uVar4 * s + uVar2,id,phi,theta,oup + 1,N,W,resid,L,xpred,amse);
  if (0 < L) {
    uVar7 = 0;
    do {
      xpred[uVar7] = xpred[uVar7] + dVar15;
      uVar7 = uVar7 + 1;
    } while ((uint)L != uVar7);
  }
  free(C);
  free(C_00);
  free(oup);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void sarima_predict(sarima_object obj, double *inp, int L, double *xpred, double *amse) {
	int d, i, N, ip, iq, ir,D,P,Q,s,p,q,t,ps,qs,j;
	double *coef1,*coef2,*delta, *W, *resid, *phi, *theta;
	double wmean;

	d = obj->d;
	N = obj->N;
	p = obj->p;
	q = obj->q;
	D = obj->D;
	P = obj->P;
	Q = obj->Q;
	s = obj->s;

	ip = p + s * P;
	iq = q + s * Q;
	ir = p + s * P;

	t = 1 + q + s*Q;
	if (ir < t) {
		ir = t;
	}
	ps = P;
	qs = Q;
	coef1 = (double*)malloc(sizeof(double)* (d + 1));
	coef2 = (double*)malloc(sizeof(double)* (D*s + 1));
	delta = (double*)malloc(sizeof(double)* (d + D*s + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);


	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	coef1[0] = coef2[0] = 1.0;

	if (d == 0 && D == 0) {
		*delta = 1.0;
		wmean = obj->mean;
	}

	if (d > 0) {
		deld(d, coef1);
	}

	if (D > 0) {
		delds(D, s, coef2);
	}

	conv(coef1, d + 1, coef2, D*s + 1, delta);
	
	for (i = 1; i <= d+D*s; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0 && D == 0) {
			W[i] -= wmean;
		}
		resid[i] = obj->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = obj->phi[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = -1.0 *  obj->theta[i];
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += obj->PHI[j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= obj->phi[i] * obj->PHI[j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] -= obj->THETA[j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += obj->theta[i] * obj->THETA[j];
		}
	}

	forkal(ip, iq, d+D*s, phi, theta, delta + 1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
	}

	free(coef1);
	free(coef2);
	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}